

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test7::releaseXFBVaryingNames(GPUShaderFP64Test7 *this)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = this->m_n_xfb_varyings;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (this->m_xfb_varyings[uVar2] != (GLchar *)0x0) {
        operator_delete__(this->m_xfb_varyings[uVar2]);
        uVar1 = this->m_n_xfb_varyings;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  operator_delete(this->m_xfb_varyings,8);
  this->m_xfb_varyings = (GLchar **)0x0;
  this->m_n_xfb_varyings = 0;
  return;
}

Assistant:

void GPUShaderFP64Test7::releaseXFBVaryingNames()
{
	for (unsigned int n_varying = 0; n_varying < m_n_xfb_varyings; ++n_varying)
	{
		delete[] m_xfb_varyings[n_varying];
	}

	delete m_xfb_varyings;
	m_xfb_varyings = DE_NULL;

	m_n_xfb_varyings = 0;
}